

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O1

bool __thiscall QHttpSocketEngine::connectInternal(QHttpSocketEngine *this)

{
  long lVar1;
  long *plVar2;
  quint16 qVar3;
  SocketState SVar4;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  *(undefined1 *)(lVar1 + 0x11e) = 0;
  if (*(int *)(lVar1 + 0x108) == 1) {
    if (*(int *)(lVar1 + 0x98) != 3) {
      QAbstractSocketEngine::setState((QAbstractSocketEngine *)this,UnconnectedState);
    }
  }
  else if (*(int *)(lVar1 + 0x108) == 2) {
    connectInternal(this);
    bVar6 = true;
    goto LAB_00226369;
  }
  if (*(int *)(lVar1 + 0x108) == 0) {
    SVar4 = QAbstractSocket::state(*(QAbstractSocket **)(lVar1 + 0xf8));
    if (SVar4 == UnconnectedState) {
      QAbstractSocketEngine::setState((QAbstractSocketEngine *)this,ConnectingState);
      (**(code **)(**(long **)(lVar1 + 0xf8) + 0x108))(*(long **)(lVar1 + 0xf8),0x10000);
      plVar2 = *(long **)(lVar1 + 0xf8);
      QNetworkProxy::hostName(&local_48,(QNetworkProxy *)(lVar1 + 0xd8));
      qVar3 = QNetworkProxy::port((QNetworkProxy *)(lVar1 + 0xd8));
      (**(code **)(*plVar2 + 0xf8))(plVar2,&local_48,qVar3,3,2);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  lVar5 = (**(code **)(*(long *)this + 0xb0))(this);
  if (lVar5 != 0) {
    slotSocketReadNotification(this);
  }
  bVar6 = *(int *)(lVar1 + 0x98) == 3;
LAB_00226369:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpSocketEngine::connectInternal()
{
    Q_D(QHttpSocketEngine);

    d->credentialsSent = false;

    // If the handshake is done, enter ConnectedState state and return true.
    if (d->state == Connected) {
        qWarning("QHttpSocketEngine::connectToHost: called when already connected");
        setState(QAbstractSocket::ConnectedState);
        return true;
    }

    if (d->state == ConnectSent && d->socketState != QAbstractSocket::ConnectedState)
        setState(QAbstractSocket::UnconnectedState);

    // Handshake isn't done. If unconnected, start connecting.
    if (d->state == None && d->socket->state() == QAbstractSocket::UnconnectedState) {
        setState(QAbstractSocket::ConnectingState);
        //limit buffer in internal socket, data is buffered in the external socket under application control
        d->socket->setReadBufferSize(65536);
        d->socket->connectToHost(d->proxy.hostName(), d->proxy.port());
    }

    // If connected (might happen right away, at least for localhost services
    // on some BSD systems), there might already be bytes available.
    if (bytesAvailable())
        slotSocketReadNotification();

    return d->socketState == QAbstractSocket::ConnectedState;
}